

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

size_t nhdp_domain_encode_willingness_tlvvalue(uint8_t *tlvvalue,size_t tlvsize)

{
  uint uVar1;
  byte bVar2;
  uint8_t uVar3;
  list_entity *plVar4;
  ulong uVar5;
  ulong uVar6;
  
  memset(tlvvalue,0,tlvsize);
  uVar3 = _flooding_domain.local_willingness;
  *tlvvalue = _flooding_domain.local_willingness;
  if (((&log_global_mask)[LOG_NHDP_W] & 1) != 0) {
    oonf_log(1,(ulong)LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x346,0,0,
             "Set flooding willingness: %u",uVar3);
  }
  plVar4 = &_domain_list;
  uVar6 = 0;
  while( true ) {
    plVar4 = plVar4->next;
    if (plVar4->prev == _domain_list.prev) {
      return uVar6;
    }
    uVar1 = *(uint *)((long)&plVar4[-0x27].next + 4);
    uVar5 = (ulong)((int)(uVar1 + 1) / 2);
    if (tlvsize <= uVar5) break;
    if (uVar6 < uVar5 + 1) {
      uVar6 = uVar5 + 1;
    }
    bVar2 = *(byte *)&plVar4[-0x27].next & 0xf;
    if ((uVar1 & 1) == 0) {
      bVar2 = *(byte *)&plVar4[-0x27].next << 4;
    }
    if (((&log_global_mask)[LOG_NHDP_W] & 1) != 0) {
      oonf_log(1,(ulong)LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x35b,0,0,
               "Set routing willingness for domain %u: %x (%zu)",
               *(undefined1 *)((long)&plVar4[-0x27].next + 1),bVar2,uVar5);
    }
    tlvvalue[uVar5] = tlvvalue[uVar5] | bVar2;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
nhdp_domain_encode_willingness_tlvvalue(uint8_t *tlvvalue, size_t tlvsize) {
  struct nhdp_domain *domain;
  uint8_t value;
  size_t idx, len;

  memset(tlvvalue, 0, tlvsize);
  len = 0;

  /* set flooding willingness */
  tlvvalue[0] = _flooding_domain.local_willingness;
  OONF_DEBUG(LOG_NHDP_W, "Set flooding willingness: %u", _flooding_domain.local_willingness);

  /* set routing willingness */
  list_for_each_element(&_domain_list, domain, _node) {
    idx = (domain->index + 1) / 2;
    if (idx >= tlvsize) {
      return -1;
    }
    if (idx + 1 > len) {
      len = idx + 1;
    }

    value = domain->local_willingness & RFC7181_WILLINGNESS_MASK;

    if ((domain->index & 1) == 0) {
      value <<= RFC7181_WILLINGNESS_SHIFT;
    }

    OONF_DEBUG(LOG_NHDP_W,
      "Set routing willingness for domain %u: %x"
      " (%" PRINTF_SIZE_T_SPECIFIER ")",
      domain->ext, value, idx);

    tlvvalue[idx] |= value;
  }

  return len;
}